

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

int PaAlsa_LoadLibrary(void)

{
  alsa_snd_pcm_open = snd_pcm_open;
  alsa_snd_pcm_close = snd_pcm_close;
  alsa_snd_pcm_nonblock = snd_pcm_nonblock;
  alsa_snd_pcm_frames_to_bytes = snd_pcm_frames_to_bytes;
  alsa_snd_pcm_prepare = snd_pcm_prepare;
  alsa_snd_pcm_start = snd_pcm_start;
  alsa_snd_pcm_resume = snd_pcm_resume;
  alsa_snd_pcm_wait = snd_pcm_wait;
  alsa_snd_pcm_state = snd_pcm_state;
  alsa_snd_pcm_avail_update = snd_pcm_avail_update;
  alsa_snd_pcm_areas_silence = snd_pcm_areas_silence;
  alsa_snd_pcm_mmap_begin = snd_pcm_mmap_begin;
  alsa_snd_pcm_mmap_commit = snd_pcm_mmap_commit;
  alsa_snd_pcm_readi = snd_pcm_readi;
  alsa_snd_pcm_readn = snd_pcm_readn;
  alsa_snd_pcm_writei = snd_pcm_writei;
  alsa_snd_pcm_writen = snd_pcm_writen;
  alsa_snd_pcm_drain = snd_pcm_drain;
  alsa_snd_pcm_recover = snd_pcm_recover;
  alsa_snd_pcm_drop = snd_pcm_drop;
  alsa_snd_pcm_area_copy = snd_pcm_area_copy;
  alsa_snd_pcm_poll_descriptors = snd_pcm_poll_descriptors;
  alsa_snd_pcm_poll_descriptors_count = snd_pcm_poll_descriptors_count;
  alsa_snd_pcm_poll_descriptors_revents = snd_pcm_poll_descriptors_revents;
  alsa_snd_pcm_format_size = snd_pcm_format_size;
  alsa_snd_pcm_link = snd_pcm_link;
  alsa_snd_pcm_delay = snd_pcm_delay;
  alsa_snd_pcm_hw_params_sizeof = snd_pcm_hw_params_sizeof;
  alsa_snd_pcm_hw_params_malloc = snd_pcm_hw_params_malloc;
  alsa_snd_pcm_hw_params_free = snd_pcm_hw_params_free;
  alsa_snd_pcm_hw_params_any = snd_pcm_hw_params_any;
  alsa_snd_pcm_hw_params_set_access = snd_pcm_hw_params_set_access;
  alsa_snd_pcm_hw_params_set_format = snd_pcm_hw_params_set_format;
  alsa_snd_pcm_hw_params_set_channels = snd_pcm_hw_params_set_channels;
  alsa_snd_pcm_hw_params_set_rate_near = snd_pcm_hw_params_set_rate_near;
  alsa_snd_pcm_hw_params_set_rate = snd_pcm_hw_params_set_rate;
  alsa_snd_pcm_hw_params_set_rate_resample = snd_pcm_hw_params_set_rate_resample;
  alsa_snd_pcm_hw_params_set_buffer_size = snd_pcm_hw_params_set_buffer_size;
  alsa_snd_pcm_hw_params_set_buffer_size_near = snd_pcm_hw_params_set_buffer_size_near;
  alsa_snd_pcm_hw_params_set_buffer_size_min = snd_pcm_hw_params_set_buffer_size_min;
  alsa_snd_pcm_hw_params_set_period_size_near = snd_pcm_hw_params_set_period_size_near;
  alsa_snd_pcm_hw_params_set_periods_integer = snd_pcm_hw_params_set_periods_integer;
  alsa_snd_pcm_hw_params_set_periods_min = snd_pcm_hw_params_set_periods_min;
  alsa_snd_pcm_hw_params_get_buffer_size = snd_pcm_hw_params_get_buffer_size;
  alsa_snd_pcm_hw_params_get_channels_min = snd_pcm_hw_params_get_channels_min;
  alsa_snd_pcm_hw_params_get_channels_max = snd_pcm_hw_params_get_channels_max;
  alsa_snd_pcm_hw_params_test_period_size = snd_pcm_hw_params_test_period_size;
  alsa_snd_pcm_hw_params_test_format = snd_pcm_hw_params_test_format;
  alsa_snd_pcm_hw_params_test_access = snd_pcm_hw_params_test_access;
  alsa_snd_pcm_hw_params_dump = snd_pcm_hw_params_dump;
  alsa_snd_pcm_hw_params = snd_pcm_hw_params;
  alsa_snd_pcm_hw_params_get_periods_min = snd_pcm_hw_params_get_periods_min;
  alsa_snd_pcm_hw_params_get_periods_max = snd_pcm_hw_params_get_periods_max;
  alsa_snd_pcm_hw_params_set_period_size = snd_pcm_hw_params_set_period_size;
  alsa_snd_pcm_hw_params_get_period_size_min = snd_pcm_hw_params_get_period_size_min;
  alsa_snd_pcm_hw_params_get_period_size_max = snd_pcm_hw_params_get_period_size_max;
  alsa_snd_pcm_hw_params_get_buffer_size_max = snd_pcm_hw_params_get_buffer_size_max;
  alsa_snd_pcm_hw_params_get_rate_min = snd_pcm_hw_params_get_rate_min;
  alsa_snd_pcm_hw_params_get_rate_max = snd_pcm_hw_params_get_rate_max;
  alsa_snd_pcm_hw_params_get_rate_numden = snd_pcm_hw_params_get_rate_numden;
  alsa_snd_pcm_sw_params_sizeof = snd_pcm_sw_params_sizeof;
  alsa_snd_pcm_sw_params_malloc = snd_pcm_sw_params_malloc;
  alsa_snd_pcm_sw_params_current = snd_pcm_sw_params_current;
  alsa_snd_pcm_sw_params_set_avail_min = snd_pcm_sw_params_set_avail_min;
  alsa_snd_pcm_sw_params = snd_pcm_sw_params;
  alsa_snd_pcm_sw_params_free = snd_pcm_sw_params_free;
  alsa_snd_pcm_sw_params_set_start_threshold = snd_pcm_sw_params_set_start_threshold;
  alsa_snd_pcm_sw_params_set_stop_threshold = snd_pcm_sw_params_set_stop_threshold;
  alsa_snd_pcm_sw_params_get_boundary = snd_pcm_sw_params_get_boundary;
  alsa_snd_pcm_sw_params_set_silence_threshold = snd_pcm_sw_params_set_silence_threshold;
  alsa_snd_pcm_sw_params_set_silence_size = snd_pcm_sw_params_set_silence_size;
  alsa_snd_pcm_sw_params_set_xfer_align = snd_pcm_sw_params_set_xfer_align;
  alsa_snd_pcm_sw_params_set_tstamp_mode = snd_pcm_sw_params_set_tstamp_mode;
  alsa_snd_pcm_info = snd_pcm_info;
  alsa_snd_pcm_info_sizeof = snd_pcm_info_sizeof;
  alsa_snd_pcm_info_malloc = snd_pcm_info_malloc;
  alsa_snd_pcm_info_free = snd_pcm_info_free;
  alsa_snd_pcm_info_set_device = snd_pcm_info_set_device;
  alsa_snd_pcm_info_set_subdevice = snd_pcm_info_set_subdevice;
  alsa_snd_pcm_info_set_stream = snd_pcm_info_set_stream;
  alsa_snd_pcm_info_get_name = snd_pcm_info_get_name;
  alsa_snd_pcm_info_get_card = snd_pcm_info_get_card;
  alsa_snd_ctl_pcm_next_device = snd_ctl_pcm_next_device;
  alsa_snd_ctl_pcm_info = snd_ctl_pcm_info;
  alsa_snd_ctl_open = snd_ctl_open;
  alsa_snd_ctl_close = snd_ctl_close;
  alsa_snd_ctl_card_info_malloc = snd_ctl_card_info_malloc;
  alsa_snd_ctl_card_info_free = snd_ctl_card_info_free;
  alsa_snd_ctl_card_info = snd_ctl_card_info;
  alsa_snd_ctl_card_info_sizeof = snd_ctl_card_info_sizeof;
  alsa_snd_ctl_card_info_get_name = snd_ctl_card_info_get_name;
  alsa_snd_config = (snd_config_ft *)&snd_config;
  alsa_snd_config_update = snd_config_update;
  alsa_snd_config_search = snd_config_search;
  alsa_snd_config_iterator_entry = snd_config_iterator_entry;
  alsa_snd_config_iterator_first = snd_config_iterator_first;
  alsa_snd_config_iterator_end = snd_config_iterator_end;
  alsa_snd_config_iterator_next = snd_config_iterator_next;
  alsa_snd_config_get_string = snd_config_get_string;
  alsa_snd_config_get_id = snd_config_get_id;
  alsa_snd_config_update_free_global = snd_config_update_free_global;
  alsa_snd_pcm_status = snd_pcm_status;
  alsa_snd_pcm_status_sizeof = snd_pcm_status_sizeof;
  alsa_snd_pcm_status_get_tstamp = snd_pcm_status_get_tstamp;
  alsa_snd_pcm_status_get_state = snd_pcm_status_get_state;
  alsa_snd_pcm_status_get_trigger_tstamp = snd_pcm_status_get_trigger_tstamp;
  alsa_snd_pcm_status_get_delay = snd_pcm_status_get_delay;
  alsa_snd_card_next = snd_card_next;
  alsa_snd_asoundlib_version = snd_asoundlib_version;
  alsa_snd_strerror = snd_strerror;
  alsa_snd_output_stdio_attach = snd_output_stdio_attach;
  return 1;
}

Assistant:

static int PaAlsa_LoadLibrary()
{
#ifdef PA_ALSA_DYNAMIC

    PA_DEBUG(( "%s: loading ALSA library file - %s\n", __FUNCTION__, g_AlsaLibName ));

    dlerror();
    g_AlsaLib = dlopen(g_AlsaLibName, (RTLD_NOW|RTLD_GLOBAL) );
    if (g_AlsaLib == NULL)
    {
        PA_DEBUG(( "%s: failed dlopen() ALSA library file - %s, error: %s\n", __FUNCTION__, g_AlsaLibName, dlerror() ));
        return 0;
    }

    PA_DEBUG(( "%s: loading ALSA API\n", __FUNCTION__ ));

    #define _PA_LOAD_FUNC(x) do {             \
        alsa_##x = dlsym( g_AlsaLib, #x );      \
        if( alsa_##x == NULL ) {               \
            PA_DEBUG(( "%s: symbol [%s] not found in - %s, error: %s\n", __FUNCTION__, #x, g_AlsaLibName, dlerror() )); }\
        } while(0)

#else

    #define _PA_LOAD_FUNC(x) alsa_##x = &x

#endif

    _PA_LOAD_FUNC(snd_pcm_open);
    _PA_LOAD_FUNC(snd_pcm_close);
    _PA_LOAD_FUNC(snd_pcm_nonblock);
    _PA_LOAD_FUNC(snd_pcm_frames_to_bytes);
    _PA_LOAD_FUNC(snd_pcm_prepare);
    _PA_LOAD_FUNC(snd_pcm_start);
    _PA_LOAD_FUNC(snd_pcm_resume);
    _PA_LOAD_FUNC(snd_pcm_wait);
    _PA_LOAD_FUNC(snd_pcm_state);
    _PA_LOAD_FUNC(snd_pcm_avail_update);
    _PA_LOAD_FUNC(snd_pcm_areas_silence);
    _PA_LOAD_FUNC(snd_pcm_mmap_begin);
    _PA_LOAD_FUNC(snd_pcm_mmap_commit);
    _PA_LOAD_FUNC(snd_pcm_readi);
    _PA_LOAD_FUNC(snd_pcm_readn);
    _PA_LOAD_FUNC(snd_pcm_writei);
    _PA_LOAD_FUNC(snd_pcm_writen);
    _PA_LOAD_FUNC(snd_pcm_drain);
    _PA_LOAD_FUNC(snd_pcm_recover);
    _PA_LOAD_FUNC(snd_pcm_drop);
    _PA_LOAD_FUNC(snd_pcm_area_copy);
    _PA_LOAD_FUNC(snd_pcm_poll_descriptors);
    _PA_LOAD_FUNC(snd_pcm_poll_descriptors_count);
    _PA_LOAD_FUNC(snd_pcm_poll_descriptors_revents);
    _PA_LOAD_FUNC(snd_pcm_format_size);
    _PA_LOAD_FUNC(snd_pcm_link);
    _PA_LOAD_FUNC(snd_pcm_delay);

    _PA_LOAD_FUNC(snd_pcm_hw_params_sizeof);
    _PA_LOAD_FUNC(snd_pcm_hw_params_malloc);
    _PA_LOAD_FUNC(snd_pcm_hw_params_free);
    _PA_LOAD_FUNC(snd_pcm_hw_params_any);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_access);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_format);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_channels);
//    _PA_LOAD_FUNC(snd_pcm_hw_params_set_periods_near);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_rate_near);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_rate);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_rate_resample);
//    _PA_LOAD_FUNC(snd_pcm_hw_params_set_buffer_time_near);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_buffer_size);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_buffer_size_near);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_buffer_size_min);
//    _PA_LOAD_FUNC(snd_pcm_hw_params_set_period_time_near);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_period_size_near);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_periods_integer);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_periods_min);

    _PA_LOAD_FUNC(snd_pcm_hw_params_get_buffer_size);
//    _PA_LOAD_FUNC(snd_pcm_hw_params_get_period_size);
//    _PA_LOAD_FUNC(snd_pcm_hw_params_get_access);
//    _PA_LOAD_FUNC(snd_pcm_hw_params_get_periods);
//    _PA_LOAD_FUNC(snd_pcm_hw_params_get_rate);
    _PA_LOAD_FUNC(snd_pcm_hw_params_get_channels_min);
    _PA_LOAD_FUNC(snd_pcm_hw_params_get_channels_max);

    _PA_LOAD_FUNC(snd_pcm_hw_params_test_period_size);
    _PA_LOAD_FUNC(snd_pcm_hw_params_test_format);
    _PA_LOAD_FUNC(snd_pcm_hw_params_test_access);
    _PA_LOAD_FUNC(snd_pcm_hw_params_dump);
    _PA_LOAD_FUNC(snd_pcm_hw_params);

    _PA_LOAD_FUNC(snd_pcm_hw_params_get_periods_min);
    _PA_LOAD_FUNC(snd_pcm_hw_params_get_periods_max);
    _PA_LOAD_FUNC(snd_pcm_hw_params_set_period_size);
    _PA_LOAD_FUNC(snd_pcm_hw_params_get_period_size_min);
    _PA_LOAD_FUNC(snd_pcm_hw_params_get_period_size_max);
    _PA_LOAD_FUNC(snd_pcm_hw_params_get_buffer_size_max);
    _PA_LOAD_FUNC(snd_pcm_hw_params_get_rate_min);
    _PA_LOAD_FUNC(snd_pcm_hw_params_get_rate_max);
    _PA_LOAD_FUNC(snd_pcm_hw_params_get_rate_numden);

    _PA_LOAD_FUNC(snd_pcm_sw_params_sizeof);
    _PA_LOAD_FUNC(snd_pcm_sw_params_malloc);
    _PA_LOAD_FUNC(snd_pcm_sw_params_current);
    _PA_LOAD_FUNC(snd_pcm_sw_params_set_avail_min);
    _PA_LOAD_FUNC(snd_pcm_sw_params);
    _PA_LOAD_FUNC(snd_pcm_sw_params_free);
    _PA_LOAD_FUNC(snd_pcm_sw_params_set_start_threshold);
    _PA_LOAD_FUNC(snd_pcm_sw_params_set_stop_threshold);
    _PA_LOAD_FUNC(snd_pcm_sw_params_get_boundary);
    _PA_LOAD_FUNC(snd_pcm_sw_params_set_silence_threshold);
    _PA_LOAD_FUNC(snd_pcm_sw_params_set_silence_size);
    _PA_LOAD_FUNC(snd_pcm_sw_params_set_xfer_align);
    _PA_LOAD_FUNC(snd_pcm_sw_params_set_tstamp_mode);

    _PA_LOAD_FUNC(snd_pcm_info);
    _PA_LOAD_FUNC(snd_pcm_info_sizeof);
    _PA_LOAD_FUNC(snd_pcm_info_malloc);
    _PA_LOAD_FUNC(snd_pcm_info_free);
    _PA_LOAD_FUNC(snd_pcm_info_set_device);
    _PA_LOAD_FUNC(snd_pcm_info_set_subdevice);
    _PA_LOAD_FUNC(snd_pcm_info_set_stream);
    _PA_LOAD_FUNC(snd_pcm_info_get_name);
    _PA_LOAD_FUNC(snd_pcm_info_get_card);

    _PA_LOAD_FUNC(snd_ctl_pcm_next_device);
    _PA_LOAD_FUNC(snd_ctl_pcm_info);
    _PA_LOAD_FUNC(snd_ctl_open);
    _PA_LOAD_FUNC(snd_ctl_close);
    _PA_LOAD_FUNC(snd_ctl_card_info_malloc);
    _PA_LOAD_FUNC(snd_ctl_card_info_free);
    _PA_LOAD_FUNC(snd_ctl_card_info);
    _PA_LOAD_FUNC(snd_ctl_card_info_sizeof);
    _PA_LOAD_FUNC(snd_ctl_card_info_get_name);

    _PA_LOAD_FUNC(snd_config);
    _PA_LOAD_FUNC(snd_config_update);
    _PA_LOAD_FUNC(snd_config_search);
    _PA_LOAD_FUNC(snd_config_iterator_entry);
    _PA_LOAD_FUNC(snd_config_iterator_first);
    _PA_LOAD_FUNC(snd_config_iterator_end);
    _PA_LOAD_FUNC(snd_config_iterator_next);
    _PA_LOAD_FUNC(snd_config_get_string);
    _PA_LOAD_FUNC(snd_config_get_id);
    _PA_LOAD_FUNC(snd_config_update_free_global);

    _PA_LOAD_FUNC(snd_pcm_status);
    _PA_LOAD_FUNC(snd_pcm_status_sizeof);
    _PA_LOAD_FUNC(snd_pcm_status_get_tstamp);
    _PA_LOAD_FUNC(snd_pcm_status_get_state);
    _PA_LOAD_FUNC(snd_pcm_status_get_trigger_tstamp);
    _PA_LOAD_FUNC(snd_pcm_status_get_delay);

    _PA_LOAD_FUNC(snd_card_next);
    _PA_LOAD_FUNC(snd_asoundlib_version);
    _PA_LOAD_FUNC(snd_strerror);
    _PA_LOAD_FUNC(snd_output_stdio_attach);
#undef _PA_LOAD_FUNC

#ifdef PA_ALSA_DYNAMIC
    PA_DEBUG(( "%s: loaded ALSA API - ok\n", __FUNCTION__ ));

#define _PA_VALIDATE_LOAD_REPLACEMENT(x)\
    do {\
        if( alsa_##x == NULL )\
        {\
            alsa_##x = &_PA_LOCAL_IMPL(x);\
            PA_DEBUG(( "%s: replacing [%s] with local implementation\n", __FUNCTION__, #x ));\
        }\
    } while (0)

    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_set_rate_near);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_set_buffer_size_near);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_set_period_size_near);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_get_channels_min);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_get_channels_max);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_get_periods_min);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_get_periods_max);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_get_period_size_min);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_get_period_size_max);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_get_buffer_size_max);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_get_rate_min);
    _PA_VALIDATE_LOAD_REPLACEMENT(snd_pcm_hw_params_get_rate_max);

#undef _PA_LOCAL_IMPL
#undef _PA_VALIDATE_LOAD_REPLACEMENT

#endif // PA_ALSA_DYNAMIC

    return 1;
}